

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darts.h
# Opt level: O2

id_type __thiscall
Darts::Details::DawgBuilder::find_unit(DawgBuilder *this,id_type id,id_type *hash_id)

{
  char *pcVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  uint uVar5;
  id_type iVar6;
  
  uVar5 = hash_unit(this,id);
  pcVar1 = (this->table_).buf_.array_;
  uVar2 = (this->table_).size_;
  do {
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar2;
    auVar4 = ZEXT416(uVar5);
    iVar6 = SUB164(auVar4 % auVar3,0);
    *hash_id = iVar6;
    uVar5 = iVar6 + 1;
  } while (*(int *)(pcVar1 + SUB168(auVar4 % auVar3,0) * 4) != 0);
  return 0;
}

Assistant:

inline id_type DawgBuilder::find_unit(id_type id, id_type *hash_id) const {
  *hash_id = hash_unit(id) % table_.size();
  for ( ; ; *hash_id = (*hash_id + 1) % table_.size()) {
    id_type unit_id = table_[*hash_id];
    if (unit_id == 0) {
      break;
    }

    // There must not be the same unit.
  }
  return 0;
}